

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O1

void __thiscall
bioparser::test::BioparserSamTest_CompressedParseWhole_Test::
~BioparserSamTest_CompressedParseWhole_Test(BioparserSamTest_CompressedParseWhole_Test *this)

{
  Parser<bioparser::test::SamOverlap> *pPVar1;
  
  (this->super_BioparserSamTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserSamTest_00158e18;
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::~vector(&(this->super_BioparserSamTest).o);
  pPVar1 = (this->super_BioparserSamTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_false>.
           _M_head_impl;
  if (pPVar1 != (Parser<bioparser::test::SamOverlap> *)0x0) {
    (*pPVar1->_vptr_Parser[1])();
  }
  (this->super_BioparserSamTest).p._M_t.
  super___uniq_ptr_impl<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
  .super__Head_base<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_false>._M_head_impl =
       (Parser<bioparser::test::SamOverlap> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserSamTest, CompressedParseWhole) {
  Setup("sample.sam.gz");
  o = p->Parse(-1);
  Check();
}